

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O2

string * __thiscall
Link::writeStatusChange_abi_cxx11_(string *__return_storage_ptr__,Link *this,int oldStatus)

{
  ostream *poVar1;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [32];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"    ");
  (*(this->super_Element)._vptr_Element[3])(local_48,this);
  poVar1 = std::operator<<(poVar1,local_48);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_Element).name);
  poVar1 = std::operator<<(poVar1,(string *)&s_From_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,(string *)(linkStatusWords_abi_cxx11_ + oldStatus));
  poVar1 = std::operator<<(poVar1,(string *)&s_To_abi_cxx11_);
  std::operator<<(poVar1,(string *)(linkStatusWords_abi_cxx11_ + this->status));
  std::__cxx11::string::~string(local_48);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return __return_storage_ptr__;
}

Assistant:

string Link::writeStatusChange(int oldStatus)
{
    stringstream ss;
    ss << "    " << typeStr() << " " <<
	    name << s_From << linkStatusWords[oldStatus] << s_To <<
	    linkStatusWords[status];
    return ss.str();
}